

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O1

void Omega_h::separate_upward_with_codes
               (LO nlh,LOs *lh2hl,Int nlows_per_high,Write<int> *lh2h,Bytes *down_codes,
               Write<signed_char> *codes)

{
  int iVar1;
  LO LVar2;
  long *plVar3;
  ulong **__dest;
  Alloc *pAVar4;
  long lVar5;
  ulong *puVar6;
  ulong uVar7;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  type f;
  size_type __dnew;
  ScopedTimer local_12a;
  ScopedTimer local_129;
  ulong **local_128;
  ulong *local_120;
  ulong *local_118 [2];
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  Alloc *local_e8;
  Alloc *local_e0;
  undefined1 local_d8 [56];
  Alloc *local_a0;
  Alloc *local_98;
  undefined1 local_90 [32];
  void *local_70;
  Alloc *local_68;
  void *local_60;
  LO local_58;
  Int local_54;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_108 = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  local_54 = nlows_per_high;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_108);
  pAVar4 = (Alloc *)(plVar3 + 2);
  if ((Alloc *)*plVar3 == pAVar4) {
    local_90._0_8_ = pAVar4->size;
    local_90._8_8_ = plVar3[3];
    local_a0 = (Alloc *)local_90;
  }
  else {
    local_90._0_8_ = pAVar4->size;
    local_a0 = (Alloc *)*plVar3;
  }
  local_98 = (Alloc *)plVar3[1];
  *plVar3 = (long)pAVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_128 = local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_128,3,0xcd);
  local_120 = (ulong *)((long)&local_98->size + (long)local_120);
  puVar6 = (ulong *)0xf;
  if (local_a0 != (Alloc *)local_90) {
    puVar6 = (ulong *)local_90._0_8_;
  }
  if (puVar6 < local_120) {
    puVar6 = (ulong *)0xf;
    if (local_128 != local_118) {
      puVar6 = local_118[0];
    }
    if (puVar6 < local_120) goto LAB_001ca10b;
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_001ca10b:
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_128);
  }
  local_e8 = (Alloc *)local_d8;
  pAVar4 = (Alloc *)(plVar3 + 2);
  if ((Alloc *)*plVar3 == pAVar4) {
    local_d8._0_8_ = pAVar4->size;
    local_d8._8_8_ = plVar3[3];
  }
  else {
    local_d8._0_8_ = pAVar4->size;
    local_e8 = (Alloc *)*plVar3;
  }
  local_e0 = (Alloc *)plVar3[1];
  *plVar3 = (long)pAVar4;
  plVar3[1] = 0;
  *(undefined1 *)&pAVar4->size = 0;
  local_58 = nlh;
  begin_code("separate_upward_with_codes",(char *)local_e8);
  if (local_e8 != (Alloc *)local_d8) {
    operator_delete(local_e8,local_d8._0_8_ + 1);
  }
  if (local_128 != local_118) {
    operator_delete(local_128,(long)local_118[0] + 1);
  }
  if (local_a0 != (Alloc *)local_90) {
    operator_delete(local_a0,local_90._0_8_ + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  local_a0 = (lh2hl->write_).shared_alloc_.alloc;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(local_a0->size * 8 + 1);
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  local_98 = (Alloc *)(lh2hl->write_).shared_alloc_.direct_ptr;
  local_90._0_4_ = local_54;
  local_90._8_8_ = (lh2h->shared_alloc_).alloc;
  if ((local_90._8_8_ & 7) == 0 && (Alloc *)local_90._8_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90._8_8_ = ((Alloc *)local_90._8_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_90._8_8_)->use_count = ((Alloc *)local_90._8_8_)->use_count + 1;
    }
  }
  local_90._16_8_ = (lh2h->shared_alloc_).direct_ptr;
  local_90._24_8_ = (down_codes->write_).shared_alloc_.alloc;
  if ((local_90._24_8_ & 7) == 0 && (Alloc *)local_90._24_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90._24_8_ = ((Alloc *)local_90._24_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_90._24_8_)->use_count = ((Alloc *)local_90._24_8_)->use_count + 1;
    }
  }
  local_70 = (down_codes->write_).shared_alloc_.direct_ptr;
  local_68 = (codes->shared_alloc_).alloc;
  if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68 = (Alloc *)(local_68->size * 8 + 1);
    }
    else {
      local_68->use_count = local_68->use_count + 1;
    }
  }
  local_60 = (codes->shared_alloc_).direct_ptr;
  local_128 = local_118;
  local_50 = (ulong *)0x5d;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_128,(ulong)&local_50);
  puVar6 = local_50;
  local_118[0] = local_50;
  local_128 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_120 = puVar6;
  *(undefined1 *)((long)__dest + (long)puVar6) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_128);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_f8 = *puVar6;
    lStack_f0 = plVar3[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar6;
    local_108 = (ulong *)*plVar3;
  }
  local_100 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\x02');
  *(undefined2 *)local_50 = 0x3438;
  uVar7 = 0xf;
  if (local_108 != &local_f8) {
    uVar7 = local_f8;
  }
  if (uVar7 < (ulong)(local_48 + local_100)) {
    uVar7 = 0xf;
    if (local_50 != local_40) {
      uVar7 = local_40[0];
    }
    if ((ulong)(local_48 + local_100) <= uVar7) {
      plVar3 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_50,0,(char *)0x0,(ulong)local_108);
      goto LAB_001ca478;
    }
  }
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_50);
LAB_001ca478:
  pAVar4 = (Alloc *)(plVar3 + 2);
  if ((Alloc *)*plVar3 == pAVar4) {
    local_d8._0_8_ = pAVar4->size;
    local_d8._8_8_ = plVar3[3];
    local_e8 = (Alloc *)local_d8;
  }
  else {
    local_d8._0_8_ = pAVar4->size;
    local_e8 = (Alloc *)*plVar3;
  }
  local_e0 = (Alloc *)plVar3[1];
  *plVar3 = (long)pAVar4;
  plVar3[1] = 0;
  *(undefined1 *)&pAVar4->size = 0;
  begin_code("parallel_for",(char *)local_e8);
  if (local_e8 != (Alloc *)local_d8) {
    operator_delete(local_e8,local_d8._0_8_ + 1);
  }
  LVar2 = local_58;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_128 != local_118) {
    operator_delete(local_128,(long)local_118[0] + 1);
  }
  if (0 < LVar2) {
    local_e8 = local_a0;
    if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
      local_e8 = (Alloc *)(local_a0->size * 8 + 1);
    }
    local_e0 = local_98;
    local_d8._0_4_ = local_90._0_4_;
    local_d8._8_8_ = local_90._8_8_;
    if ((local_90._8_8_ & 7) == 0 && (Alloc *)local_90._8_8_ != (Alloc *)0x0) {
      local_d8._8_8_ = *(size_t *)local_90._8_8_ * 8 + 1;
    }
    local_d8._16_8_ = local_90._16_8_;
    local_d8._24_8_ = local_90._24_8_;
    if ((local_90._24_8_ & 7) == 0 && (Alloc *)local_90._24_8_ != (Alloc *)0x0) {
      local_d8._24_8_ = *(size_t *)local_90._24_8_ * 8 + 1;
    }
    local_d8._32_8_ = local_70;
    local_d8._40_8_ = local_68;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      local_d8._40_8_ = local_68->size * 8 + 1;
    }
    local_d8._48_8_ = local_60;
    entering_parallel = '\0';
    lVar5 = 0;
    do {
      iVar1 = *(int *)((long)&local_98->size + lVar5 * 4);
      *(int *)(local_90._16_8_ + lVar5 * 4) = iVar1 / (int)local_90._0_4_;
      *(byte *)((long)local_60 + lVar5) =
           *(byte *)((long)local_70 + (long)iVar1) & 7 | (char)(iVar1 % (int)local_90._0_4_) << 3;
      lVar5 = lVar5 + 1;
    } while (LVar2 != (int)lVar5);
    separate_upward_with_codes(int,Omega_h::Read<int>,int,Omega_h::Write<int>,Omega_h::Read<signed_char>,Omega_h::Write<signed_char>)
    ::$_0::~__0((__0 *)&local_e8);
  }
  ScopedTimer::~ScopedTimer(&local_129);
  separate_upward_with_codes(int,Omega_h::Read<int>,int,Omega_h::Write<int>,Omega_h::Read<signed_char>,Omega_h::Write<signed_char>)
  ::$_0::~__0((__0 *)&local_a0);
  ScopedTimer::~ScopedTimer(&local_12a);
  return;
}

Assistant:

void separate_upward_with_codes(LO const nlh, LOs const lh2hl,
    Int const nlows_per_high, Write<LO> const lh2h, Bytes const down_codes,
    Write<Byte> const codes) {
  OMEGA_H_TIME_FUNCTION;
  auto f = OMEGA_H_LAMBDA(LO lh) {
    LO const hl = lh2hl[lh];
    LO const h = hl / nlows_per_high;
    lh2h[lh] = h;
    Int const which_down = hl % nlows_per_high;
    auto const down_code = down_codes[hl];
    bool const is_flipped = code_is_flipped(down_code);
    Int const rotation = code_rotation(down_code);
    codes[lh] = make_code(is_flipped, rotation, which_down);
  };
  parallel_for(nlh, std::move(f));
}